

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void sc_export(uint8_t *dst,limb_t *x)

{
  uint8_t *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  sc_t tmp;
  limb_t local_38 [5];
  
  puVar1 = dst + 0x20;
  sc_reduce(local_38,x);
  lVar2 = 0;
  uVar3 = 0;
  uVar5 = 0;
  do {
    uVar5 = local_38[lVar2] << ((byte)uVar3 & 0x3f) | uVar5;
    uVar3 = uVar3 + 0x34;
    uVar4 = uVar3;
    if (dst < puVar1 && 7 < (int)uVar3) {
      do {
        *dst = (uint8_t)uVar5;
        dst = dst + 1;
        uVar3 = uVar4 - 8;
        uVar5 = uVar5 >> 8;
        if (uVar4 < 0x10) break;
        uVar4 = uVar3;
      } while (dst < puVar1);
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void
sc_export(uint8_t dst[32], const sc_t x)
{
	const uint8_t *endp = dst+32;
	sc_t tmp;
	uint64_t foo;
	int fill, i;

	sc_reduce(tmp, x);

	for (i = 0, foo = 0, fill = 0; i < K; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += LB; fill >= 8 && dst < endp; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
}